

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

void NULLC::HandleError(int signum,siginfo_t *info,void *ucontext)

{
  uchar *address_00;
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  ExpiredCodeBlock *pEVar4;
  uint local_3c;
  uint local_34;
  uint i;
  uint internalInstruction;
  bool isInternal;
  uintptr_t address;
  void *ucontext_local;
  siginfo_t *info_local;
  int signum_local;
  
  if (((signum == 0xb) &&
      ((currExecutor->vmState).callStackEnd <=
       (CodeGenRegVmCallStackEntry *)(info->_sifields)._sigfault.si_addr)) &&
     ((CodeGenRegVmCallStackEntry *)(info->_sifields)._sigfault.si_addr <=
      (currExecutor->vmState).callStackEnd + 0x800)) {
    ExecutorX86::Stop(currExecutor,"ERROR: call stack overflow");
    siglongjmp((__jmp_buf_tag *)errorHandler,1);
  }
  if (((signum == 0xb) &&
      ((currExecutor->vmState).dataStackEnd <= (info->_sifields)._sigfault.si_addr)) &&
     ((info->_sifields)._sigfault.si_addr <= (currExecutor->vmState).dataStackEnd + 0x2000)) {
    ExecutorX86::Stop(currExecutor,"ERROR: stack overflow");
    siglongjmp((__jmp_buf_tag *)errorHandler,1);
  }
  if (((signum == 0xb) &&
      ((currExecutor->vmState).regFileArrayEnd <=
       (RegVmRegister *)(info->_sifields)._sigfault.si_addr)) &&
     ((RegVmRegister *)(info->_sifields)._sigfault.si_addr <=
      (currExecutor->vmState).regFileArrayEnd + 0x400)) {
    ExecutorX86::Stop(currExecutor,"ERROR: register overflow");
    siglongjmp((__jmp_buf_tag *)errorHandler,1);
  }
  address_00 = *(uchar **)((long)ucontext + 0xa8);
  bVar2 = false;
  if (currExecutor->binCode <= address_00) {
    bVar2 = address_00 <= currExecutor->binCode + currExecutor->binCodeSize;
  }
  if (bVar2) {
    local_3c = GetInstructionFromAddress((uintptr_t)address_00);
  }
  else {
    local_3c = 0xffffffff;
  }
  local_34 = 0;
  do {
    uVar3 = FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::size
                      (&currExecutor->expiredCodeBlocks);
    if (uVar3 <= local_34) {
LAB_00154f4b:
      if (((currExecutor->vmState).jitCodeActive & 1U) != 0) {
        bVar2 = true;
      }
      if (bVar2) {
        if (signum == 8) {
          AddCrashStackFrame(local_3c);
          ExecutorX86::Stop(currExecutor,"ERROR: integer division by zero");
          siglongjmp((__jmp_buf_tag *)errorHandler,1);
        }
        if ((signum == 0xb) && ((info->_sifields)._sigfault.si_addr < (void *)0x10000)) {
          AddCrashStackFrame(local_3c);
          ExecutorX86::Stop(currExecutor,"ERROR: null pointer access");
          siglongjmp((__jmp_buf_tag *)errorHandler,1);
        }
        signal(signum,(__sighandler_t)0x0);
        raise(signum);
      }
      else {
        signal(signum,(__sighandler_t)0x0);
        raise(signum);
      }
      return;
    }
    pEVar4 = FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::operator[]
                       (&currExecutor->expiredCodeBlocks,local_34);
    if (pEVar4->code <= address_00) {
      pEVar4 = FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::operator[]
                         (&currExecutor->expiredCodeBlocks,local_34);
      puVar1 = pEVar4->code;
      pEVar4 = FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::operator[]
                         (&currExecutor->expiredCodeBlocks,local_34);
      if (address_00 <= puVar1 + pEVar4->codeSize) {
        bVar2 = true;
        goto LAB_00154f4b;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void HandleError(int signum, siginfo_t *info, void *ucontext)
	{
		if(signum == SIGSEGV && uintptr_t(info->si_addr) >= uintptr_t(currExecutor->vmState.callStackEnd) && uintptr_t(info->si_addr) <= uintptr_t(currExecutor->vmState.callStackEnd) + 8192)
		{
			currExecutor->Stop("ERROR: call stack overflow");
			siglongjmp(errorHandler, 1);
		}

		if(signum == SIGSEGV && uintptr_t(info->si_addr) >= uintptr_t(currExecutor->vmState.dataStackEnd) && uintptr_t(info->si_addr) <= uintptr_t(currExecutor->vmState.dataStackEnd) + 8192)
		{
			currExecutor->Stop("ERROR: stack overflow");
			siglongjmp(errorHandler, 1);
		}

		if(signum == SIGSEGV && uintptr_t(info->si_addr) >= uintptr_t(currExecutor->vmState.regFileArrayEnd) && uintptr_t(info->si_addr) <= uintptr_t(currExecutor->vmState.regFileArrayEnd) + 8192)
		{
			currExecutor->Stop("ERROR: register overflow");
			siglongjmp(errorHandler, 1);
		}

#if defined(_M_X64)
		uintptr_t address = uintptr_t(((ucontext_t*)ucontext)->uc_mcontext.gregs[REG_RIP]);
#else
		uintptr_t address = uintptr_t(((ucontext_t*)ucontext)->uc_mcontext.gregs[REG_EIP]);
#endif

		// Check that exception happened in NULLC code
		bool isInternal = address >= uintptr_t(currExecutor->binCode) && address <= uintptr_t(currExecutor->binCode + currExecutor->binCodeSize);

		unsigned internalInstruction = isInternal ? GetInstructionFromAddress(address) : ~0u;

		for(unsigned i = 0; i < currExecutor->expiredCodeBlocks.size(); i++)
		{
			if(address >= uintptr_t(currExecutor->expiredCodeBlocks[i].code) && address <= uintptr_t(currExecutor->expiredCodeBlocks[i].code + currExecutor->expiredCodeBlocks[i].codeSize))
			{
				isInternal = true;
				break;
			}
		}

		if(currExecutor->vmState.jitCodeActive)
			isInternal = true;

		if(!isInternal)
		{
			signal(signum, SIG_DFL);
			raise(signum);
			return;
		}

		if(signum == SIGFPE)
		{
			AddCrashStackFrame(internalInstruction);

			currExecutor->Stop("ERROR: integer division by zero");

			siglongjmp(errorHandler, 1);
		}

		if(signum == SIGSEGV && uintptr_t(info->si_addr) < 0x00010000)
		{
			AddCrashStackFrame(internalInstruction);

			currExecutor->Stop("ERROR: null pointer access");

			siglongjmp(errorHandler, 1);
		}

		signal(signum, SIG_DFL);
		raise(signum);
	}